

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O0

void __thiscall Imath_3_2::Matrix33<double>::makeIdentity(Matrix33<double> *this)

{
  Matrix33<double> *this_local;
  
  this->x[0][0] = 1.0;
  this->x[0][1] = 0.0;
  this->x[0][2] = 0.0;
  this->x[1][0] = 0.0;
  this->x[1][1] = 1.0;
  this->x[1][2] = 0.0;
  this->x[2][0] = 0.0;
  this->x[2][1] = 0.0;
  this->x[2][2] = 1.0;
  return;
}

Assistant:

IMATH_HOSTDEVICE inline void
Matrix33<T>::makeIdentity () IMATH_NOEXCEPT
{
    x[0][0] = 1;
    x[0][1] = 0;
    x[0][2] = 0;
    x[1][0] = 0;
    x[1][1] = 1;
    x[1][2] = 0;
    x[2][0] = 0;
    x[2][1] = 0;
    x[2][2] = 1;
}